

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockingqueue.hpp
# Opt level: O0

Chunk * __thiscall
BlockingQueue<OrderedOutput::Chunk_*>::pop(BlockingQueue<OrderedOutput::Chunk_*> *this)

{
  ulong uVar1;
  unique_lock<std::mutex> *this_00;
  condition_variable *in_RDI;
  Item item;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  Chunk *pCVar2;
  unique_lock<std::mutex> *in_stack_ffffffffffffffa0;
  anon_class_8_1_8991fb9c __p;
  
  __p.this = (BlockingQueue<OrderedOutput::Chunk_*> *)&stack0xffffffffffffffe8;
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::condition_variable::wait<BlockingQueue<OrderedOutput::Chunk*>::pop()::_lambda()_1_>
            (in_RDI,in_stack_ffffffffffffffa0,__p);
  this_00 = (unique_lock<std::mutex> *)
            std::
            queue<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::deque<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>_>
            ::front((queue<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::deque<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>_>
                     *)0x141525);
  pCVar2 = (Chunk *)this_00->_M_device;
  uVar1 = *(ulong *)&this_00->_M_owns;
  std::
  queue<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::deque<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>_>
  ::pop((queue<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::deque<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>_>
         *)0x14154a);
  if (uVar1 != 0) {
    if (*(ulong *)(in_RDI + 0xd8) < uVar1) {
      __assert_fail("totalSize >= item.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/blockingqueue.hpp"
                    ,0x2e,
                    "T BlockingQueue<OrderedOutput::Chunk *>::pop() [T = OrderedOutput::Chunk *]");
    }
    *(ulong *)(in_RDI + 0xd8) = *(long *)(in_RDI + 0xd8) - uVar1;
    std::unique_lock<std::mutex>::unlock(this_00);
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  return pCVar2;
}

Assistant:

T pop()
	{
		std::unique_lock<std::mutex> lock(mutex);

		itemsNotEmpty.wait(lock, [&]() { return !items.empty(); });

		Item item = std::move(items.front());
		items.pop();

		if (item.size > 0)
		{
			assert(totalSize >= item.size);
			totalSize -= item.size;

			lock.unlock();
			itemsNotFull.notify_all();
		}

		return std::move(item.value);
	}